

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceManager.cpp
# Opt level: O2

void __thiscall OpenMD::ForceManager::shortRangeInteractions(ForceManager *this)

{
  SelectionManager *this_00;
  _Base_ptr p_Var1;
  Snapshot *this_01;
  _Base_ptr p_Var2;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *this_02;
  _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
  *this_03;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *this_04;
  bool bVar3;
  Molecule *pMVar4;
  iterator iVar5;
  iterator iVar6;
  iterator iVar7;
  Bond *this_05;
  pointer ppBVar8;
  pointer ppTVar9;
  pointer ppIVar10;
  RigidBody *this_06;
  pointer ppRVar11;
  pointer ppBVar12;
  RealType angle;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  MoleculeIterator mi;
  potVec selectionPotential;
  RealType local_148;
  Inversion *local_140;
  Inversion *local_138;
  Inversion *local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet> local_108;
  _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
  *local_d8;
  _Base_ptr local_d0;
  _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
  *local_c8;
  _Base_ptr local_c0;
  _Base_ptr local_b8;
  _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
  *local_b0;
  MoleculeIterator local_a8;
  Vector<double,_7U> local_a0;
  Vector<double,_7U> local_68;
  
  local_a8._M_node = (_Base_ptr)0x0;
  local_108.first = (Inversion *)0x0;
  Vector<double,_7U>::Vector(&local_a0,(double *)&local_108);
  pMVar4 = SimInfo::beginMolecule(this->info_,&local_a8);
  this_00 = &this->seleMan_;
  local_b0 = (_Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
              *)&this->bendDataSets;
  local_b8 = &(this->bendDataSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d8 = (_Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
              *)&this->torsionDataSets;
  local_c0 = &(this->torsionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_c8 = (_Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
              *)&this->inversionDataSets;
  local_d0 = &(this->inversionDataSets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_110 = 0.0;
  local_118 = 0.0;
  local_120 = 0.0;
  local_128 = 0.0;
LAB_00124816:
  if (pMVar4 == (Molecule *)0x0) {
    this_01 = this->info_->sman_->currentSnapshot_;
    (*this->fDecomp_->_vptr_ForceDecomposition[2])(this->fDecomp_,this_01);
    Snapshot::setBondPotential(this_01,local_128);
    Snapshot::setBendPotential(this_01,local_120);
    Snapshot::setTorsionPotential(this_01,local_118);
    Snapshot::setInversionPotential(this_01,local_110);
    Vector<double,_7U>::Vector(&local_68,&local_a0);
    Snapshot::setSelectionPotentials(this_01,&local_68);
    return;
  }
  ppRVar11 = (pMVar4->rigidBodies_).
             super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (ppRVar11 !=
      (pMVar4->rigidBodies_).
      super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_0012484d;
  this_06 = (RigidBody *)0x0;
  while (this_06 != (RigidBody *)0x0) {
    RigidBody::updateAtoms(this_06);
    ppRVar11 = ppRVar11 + 1;
    this_06 = (RigidBody *)0x0;
    if (ppRVar11 !=
        (pMVar4->rigidBodies_).
        super__Vector_base<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_0012484d:
      this_06 = *ppRVar11;
    }
  }
  ppBVar12 = (pMVar4->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar12 !=
      (pMVar4->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_001248d6;
  this_05 = (Bond *)0x0;
  while (this_05 != (Bond *)0x0) {
    Bond::calcForce(this_05,this->doParticlePot_);
    local_128 = local_128 + this_05->potential_;
    if ((this->doPotentialSelection_ == true) &&
       ((bVar3 = SelectionManager::isSelected
                           (this_00,&(*(this_05->super_ShortRangeInteraction).atoms_.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->super_StuntDouble
                           ), bVar3 ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(this_05->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[1]->super_StuntDouble
                           ), bVar3)))) {
      local_a0.data_[6] = this_05->potential_ + local_a0.data_[6];
    }
    ppBVar12 = ppBVar12 + 1;
    this_05 = (Bond *)0x0;
    if (ppBVar12 !=
        (pMVar4->bonds_).super__Vector_base<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>._M_impl
        .super__Vector_impl_data._M_finish) {
LAB_001248d6:
      this_05 = *ppBVar12;
    }
  }
  ppBVar8 = (pMVar4->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar8 ==
      (pMVar4->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_130 = (Inversion *)0x0;
    goto LAB_001248f6;
  }
  do {
    local_130 = (Inversion *)*ppBVar8;
LAB_001248f6:
    do {
      this_02 = local_d8;
      if (local_130 == (Inversion *)0x0) {
        ppTVar9 = (pMVar4->torsions_).
                  super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_130 = (Inversion *)0x0;
        if (ppTVar9 ==
            (pMVar4->torsions_).
            super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          local_138 = (Inversion *)0x0;
          goto LAB_00124a94;
        }
        goto LAB_00124c29;
      }
      (*(local_130->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
                (local_130,&local_148,(ulong)this->doParticlePot_);
      this_04 = local_b0;
      p_Var1 = (_Base_ptr)local_130->inversionType_;
      iVar5 = std::
              _Rb_tree<OpenMD::Bend_*,_std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>,_std::_Select1st<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
              ::find((_Rb_tree<OpenMD::Bend_*,_std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>,_std::_Select1st<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>,_std::less<OpenMD::Bend_*>,_std::allocator<std::pair<OpenMD::Bend_*const,_OpenMD::BendDataSet>_>_>
                      *)local_b0,(key_type *)&local_130);
      if (iVar5._M_node == local_b8) {
        local_108.first = local_130;
        local_108.second.deltaV = 0.0;
        local_108.second.prev.angle = local_148;
        local_108.second.curr.angle = local_148;
        local_108.second.prev.potential = (RealType)p_Var1;
        local_108.second.curr.potential = (RealType)p_Var1;
        std::
        _Rb_tree<OpenMD::Bend*,std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>,std::_Select1st<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>,std::less<OpenMD::Bend*>,std::allocator<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>>
        ::_M_insert_unique<std::pair<OpenMD::Bend*const,OpenMD::BendDataSet>>
                  (this_04,(pair<OpenMD::Bend_*const,_OpenMD::BendDataSet> *)&local_108);
      }
      else {
        p_Var2 = iVar5._M_node[2]._M_parent;
        iVar5._M_node[1]._M_left = *(_Base_ptr *)(iVar5._M_node + 2);
        iVar5._M_node[1]._M_right = p_Var2;
        *(RealType *)(iVar5._M_node + 2) = local_148;
        iVar5._M_node[2]._M_parent = p_Var1;
        iVar5._M_node[1]._M_parent = (_Base_ptr)ABS((double)p_Var1 - (double)p_Var2);
      }
      if ((this->doPotentialSelection_ == true) &&
         (((bVar3 = SelectionManager::isSelected
                              (this_00,&(*(local_130->super_ShortRangeInteraction).atoms_.
                                          super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->
                                        super_StuntDouble), bVar3 ||
           (bVar3 = SelectionManager::isSelected
                              (this_00,&(local_130->super_ShortRangeInteraction).atoms_.
                                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start[1]->
                                        super_StuntDouble), bVar3)) ||
          (bVar3 = SelectionManager::isSelected
                             (this_00,&(local_130->super_ShortRangeInteraction).atoms_.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[2]->
                                       super_StuntDouble), bVar3)))) {
        local_a0.data_[6] = (double)local_130->inversionType_ + local_a0.data_[6];
      }
      local_120 = local_120 + (double)p_Var1;
      ppBVar8 = ppBVar8 + 1;
      local_130 = (Inversion *)0x0;
    } while (ppBVar8 ==
             (pMVar4->bends_).super__Vector_base<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  } while( true );
LAB_00124c29:
  local_138 = (Inversion *)*ppTVar9;
LAB_00124a94:
  while (local_138 != (Inversion *)0x0) {
    (*(local_138->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_138,&local_148,(ulong)this->doParticlePot_);
    p_Var1 = *(_Base_ptr *)((long)&(local_138->name_).field_2 + 8);
    iVar6 = std::
            _Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
            ::find((_Rb_tree<OpenMD::Torsion_*,_std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>,_std::_Select1st<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>,_std::less<OpenMD::Torsion_*>,_std::allocator<std::pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet>_>_>
                    *)this_02,(key_type *)&local_138);
    if (iVar6._M_node == local_c0) {
      local_108.first = local_138;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = local_148;
      local_108.second.curr.angle = local_148;
      local_108.second.prev.potential = (RealType)p_Var1;
      local_108.second.curr.potential = (RealType)p_Var1;
      std::
      _Rb_tree<OpenMD::Torsion*,std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>,std::_Select1st<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>,std::less<OpenMD::Torsion*>,std::allocator<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Torsion*const,OpenMD::TorsionDataSet>>
                (this_02,(pair<OpenMD::Torsion_*const,_OpenMD::TorsionDataSet> *)&local_108);
    }
    else {
      p_Var2 = iVar6._M_node[2]._M_parent;
      iVar6._M_node[1]._M_left = *(_Base_ptr *)(iVar6._M_node + 2);
      iVar6._M_node[1]._M_right = p_Var2;
      *(RealType *)(iVar6._M_node + 2) = local_148;
      iVar6._M_node[2]._M_parent = p_Var1;
      iVar6._M_node[1]._M_parent = (_Base_ptr)ABS((double)p_Var1 - (double)p_Var2);
    }
    if ((this->doPotentialSelection_ == true) &&
       (((bVar3 = SelectionManager::isSelected
                            (this_00,&(*(local_138->super_ShortRangeInteraction).atoms_.
                                        super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[1]->
                                      super_StuntDouble), bVar3)) ||
        ((bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2]->
                                      super_StuntDouble), bVar3 ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_138->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[3]->
                                      super_StuntDouble), bVar3)))))) {
      local_a0.data_[6] = *(double *)((long)&(local_138->name_).field_2 + 8) + local_a0.data_[6];
    }
    local_118 = local_118 + (double)p_Var1;
    ppTVar9 = ppTVar9 + 1;
    local_138 = (Inversion *)0x0;
    if (ppTVar9 !=
        (pMVar4->torsions_).
        super__Vector_base<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) goto LAB_00124c29;
  }
  ppIVar10 = (pMVar4->inversions_).
             super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_138 = (Inversion *)0x0;
  if (ppIVar10 !=
      (pMVar4->inversions_).
      super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
      super__Vector_impl_data._M_finish) goto LAB_00124de4;
  local_140 = (Inversion *)0x0;
  while (local_140 != (Inversion *)0x0) {
    (*(local_140->super_ShortRangeInteraction)._vptr_ShortRangeInteraction[9])
              (local_140,&local_148,(ulong)this->doParticlePot_);
    this_03 = local_c8;
    p_Var1 = (_Base_ptr)local_140->potential_;
    iVar7 = std::
            _Rb_tree<OpenMD::Inversion_*,_std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>,_std::_Select1st<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
            ::find((_Rb_tree<OpenMD::Inversion_*,_std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>,_std::_Select1st<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>,_std::less<OpenMD::Inversion_*>,_std::allocator<std::pair<OpenMD::Inversion_*const,_OpenMD::InversionDataSet>_>_>
                    *)local_c8,&local_140);
    if (iVar7._M_node == local_d0) {
      local_108.first = local_140;
      local_108.second.deltaV = 0.0;
      local_108.second.prev.angle = local_148;
      local_108.second.curr.angle = local_148;
      local_108.second.prev.potential = (RealType)p_Var1;
      local_108.second.curr.potential = (RealType)p_Var1;
      std::
      _Rb_tree<OpenMD::Inversion*,std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>,std::_Select1st<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>,std::less<OpenMD::Inversion*>,std::allocator<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>>
      ::_M_insert_unique<std::pair<OpenMD::Inversion*const,OpenMD::InversionDataSet>>
                (this_03,&local_108);
    }
    else {
      p_Var2 = iVar7._M_node[2]._M_parent;
      iVar7._M_node[1]._M_left = *(_Base_ptr *)(iVar7._M_node + 2);
      iVar7._M_node[1]._M_right = p_Var2;
      *(RealType *)(iVar7._M_node + 2) = local_148;
      iVar7._M_node[2]._M_parent = p_Var1;
      iVar7._M_node[1]._M_parent = (_Base_ptr)ABS((double)p_Var1 - (double)p_Var2);
    }
    if ((this->doPotentialSelection_ == true) &&
       ((((bVar3 = SelectionManager::isSelected
                             (this_00,&(*(local_140->super_ShortRangeInteraction).atoms_.
                                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->
                                       super_StuntDouble), bVar3 ||
          (bVar3 = SelectionManager::isSelected
                             (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                       super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                       ._M_impl.super__Vector_impl_data._M_start[1]->
                                       super_StuntDouble), bVar3)) ||
         (bVar3 = SelectionManager::isSelected
                            (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                      super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start[2]->
                                      super_StuntDouble), bVar3)) ||
        (bVar3 = SelectionManager::isSelected
                           (this_00,&(local_140->super_ShortRangeInteraction).atoms_.
                                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start[3]->super_StuntDouble
                           ), bVar3)))) {
      local_a0.data_[6] = local_140->potential_ + local_a0.data_[6];
    }
    local_110 = local_110 + (double)p_Var1;
    ppIVar10 = ppIVar10 + 1;
    local_140 = (Inversion *)0x0;
    if (ppIVar10 !=
        (pMVar4->inversions_).
        super__Vector_base<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
LAB_00124de4:
      local_140 = *ppIVar10;
    }
  }
  pMVar4 = SimInfo::nextMolecule(this->info_,&local_a8);
  goto LAB_00124816;
}

Assistant:

void ForceManager::shortRangeInteractions() {
    Molecule* mol;
    RigidBody* rb;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    SimInfo::MoleculeIterator mi;
    Molecule::RigidBodyIterator rbIter;
    Molecule::BondIterator bondIter;

    Molecule::BendIterator bendIter;
    Molecule::TorsionIterator torsionIter;
    Molecule::InversionIterator inversionIter;
    RealType bondPotential      = 0.0;
    RealType bendPotential      = 0.0;
    RealType torsionPotential   = 0.0;
    RealType inversionPotential = 0.0;
    potVec selectionPotential(0.0);

    // calculate short range interactions
    for (mol = info_->beginMolecule(mi); mol != NULL;
         mol = info_->nextMolecule(mi)) {
      // change the positions of atoms which belong to the rigidbodies
      for (rb = mol->beginRigidBody(rbIter); rb != NULL;
           rb = mol->nextRigidBody(rbIter)) {
        rb->updateAtoms();
      }

      for (bond = mol->beginBond(bondIter); bond != NULL;
           bond = mol->nextBond(bondIter)) {
        bond->calcForce(doParticlePot_);
        bondPotential += bond->getPotential();
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bond->getAtomA()) ||
              seleMan_.isSelected(bond->getAtomB())) {
            selectionPotential[BONDED_FAMILY] += bond->getPotential();
          }
        }
      }

      for (bend = mol->beginBend(bendIter); bend != NULL;
           bend = mol->nextBend(bendIter)) {
        RealType angle;
        bend->calcForce(angle, doParticlePot_);
        RealType currBendPot = bend->getPotential();

        bendPotential += bend->getPotential();
        map<Bend*, BendDataSet>::iterator i = bendDataSets.find(bend);
        if (i == bendDataSets.end()) {
          BendDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currBendPot;
          dataSet.deltaV                                  = 0.0;
          bendDataSets.insert(
              map<Bend*, BendDataSet>::value_type(bend, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currBendPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(bend->getAtomA()) ||
              seleMan_.isSelected(bend->getAtomB()) ||
              seleMan_.isSelected(bend->getAtomC())) {
            selectionPotential[BONDED_FAMILY] += bend->getPotential();
          }
        }
      }

      for (torsion = mol->beginTorsion(torsionIter); torsion != NULL;
           torsion = mol->nextTorsion(torsionIter)) {
        RealType angle;
        torsion->calcForce(angle, doParticlePot_);
        RealType currTorsionPot = torsion->getPotential();
        torsionPotential += torsion->getPotential();
        map<Torsion*, TorsionDataSet>::iterator i =
            torsionDataSets.find(torsion);
        if (i == torsionDataSets.end()) {
          TorsionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currTorsionPot;
          dataSet.deltaV                                  = 0.0;
          torsionDataSets.insert(
              map<Torsion*, TorsionDataSet>::value_type(torsion, dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currTorsionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(torsion->getAtomA()) ||
              seleMan_.isSelected(torsion->getAtomB()) ||
              seleMan_.isSelected(torsion->getAtomC()) ||
              seleMan_.isSelected(torsion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += torsion->getPotential();
          }
        }
      }

      for (inversion = mol->beginInversion(inversionIter); inversion != NULL;
           inversion = mol->nextInversion(inversionIter)) {
        RealType angle;
        inversion->calcForce(angle, doParticlePot_);
        RealType currInversionPot = inversion->getPotential();
        inversionPotential += inversion->getPotential();
        map<Inversion*, InversionDataSet>::iterator i =
            inversionDataSets.find(inversion);
        if (i == inversionDataSets.end()) {
          InversionDataSet dataSet;
          dataSet.prev.angle = dataSet.curr.angle = angle;
          dataSet.prev.potential = dataSet.curr.potential = currInversionPot;
          dataSet.deltaV                                  = 0.0;
          inversionDataSets.insert(
              map<Inversion*, InversionDataSet>::value_type(inversion,
                                                            dataSet));
        } else {
          i->second.prev.angle     = i->second.curr.angle;
          i->second.prev.potential = i->second.curr.potential;
          i->second.curr.angle     = angle;
          i->second.curr.potential = currInversionPot;
          i->second.deltaV =
              fabs(i->second.curr.potential - i->second.prev.potential);
        }
        if (doPotentialSelection_) {
          if (seleMan_.isSelected(inversion->getAtomA()) ||
              seleMan_.isSelected(inversion->getAtomB()) ||
              seleMan_.isSelected(inversion->getAtomC()) ||
              seleMan_.isSelected(inversion->getAtomD())) {
            selectionPotential[BONDED_FAMILY] += inversion->getPotential();
          }
        }
      }
    }

#ifdef IS_MPI
    // Collect from all nodes.  This should eventually be moved into a
    // SystemDecomposition, but this is a better place than in
    // Thermo to do the collection.

    MPI_Allreduce(MPI_IN_PLACE, &bondPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &bendPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &torsionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &inversionPotential, 1, MPI_REALTYPE, MPI_SUM,
                  MPI_COMM_WORLD);
    MPI_Allreduce(MPI_IN_PLACE, &selectionPotential[BONDED_FAMILY], 1,
                  MPI_REALTYPE, MPI_SUM, MPI_COMM_WORLD);
#endif

    Snapshot* curSnapshot = info_->getSnapshotManager()->getCurrentSnapshot();
    fDecomp_->setSnapshot(curSnapshot);

    curSnapshot->setBondPotential(bondPotential);
    curSnapshot->setBendPotential(bendPotential);
    curSnapshot->setTorsionPotential(torsionPotential);
    curSnapshot->setInversionPotential(inversionPotential);
    curSnapshot->setSelectionPotentials(selectionPotential);

    // RealType shortRangePotential = bondPotential + bendPotential +
    //   torsionPotential +  inversionPotential;

    // curSnapshot->setShortRangePotential(shortRangePotential);
  }